

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_cpp_generator.cc
# Opt level: O3

void __thiscall
t_cpp_generator::generate_struct_declaration
          (t_cpp_generator *this,ostream *out,t_struct *tstruct,bool is_exception,bool pointers,
          bool read,bool write,bool swap,bool is_user_struct)

{
  int *piVar1;
  pointer pcVar2;
  string name;
  byte bVar3;
  bool bVar4;
  char cVar5;
  byte pointer;
  int iVar6;
  ostream *poVar7;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  pointer pptVar8;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  undefined4 extraout_var_08;
  undefined4 extraout_var_09;
  undefined4 extraout_var_10;
  t_cpp_generator *ptVar9;
  t_type *ptVar10;
  undefined4 extraout_var_11;
  t_const_value *ptVar11;
  long *plVar12;
  iterator iVar13;
  undefined4 extraout_var_12;
  undefined4 extraout_var_13;
  undefined4 extraout_var_14;
  undefined4 extraout_var_15;
  undefined4 extraout_var_16;
  undefined4 extraout_var_17;
  undefined4 extraout_var_18;
  undefined4 extraout_var_19;
  undefined4 extraout_var_20;
  undefined4 extraout_var_21;
  undefined4 extraout_var_22;
  undefined7 in_register_00000009;
  char *pcVar14;
  pointer pptVar15;
  t_field *ptVar16;
  _Base_ptr p_Var17;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar18;
  long lVar19;
  t_type *ptVar20;
  t_cpp_generator *this_00;
  undefined7 in_register_00000081;
  undefined7 in_register_00000089;
  t_struct *ptVar21;
  bool bVar22;
  string args_indent;
  string dval;
  string extends;
  undefined4 in_stack_fffffffffffffe78;
  undefined1 in_stack_fffffffffffffe7c [12];
  string in_stack_fffffffffffffe90;
  string sVar23;
  undefined7 in_stack_fffffffffffffe91;
  undefined7 uVar24;
  size_type local_168;
  undefined1 local_160 [16];
  string local_150;
  t_struct *local_130;
  undefined4 local_124;
  undefined4 local_120;
  int local_11c;
  undefined4 local_118;
  uint local_114;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_110;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_100;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_f0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_e0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_d0;
  char local_c0 [16];
  _Base_ptr local_b0;
  _Base_ptr local_a8;
  _Base_ptr local_a0;
  _Base_ptr p_Stack_98;
  t_type *local_90 [2];
  undefined1 local_80 [48];
  undefined1 local_50 [32];
  
  local_118 = (undefined4)CONCAT71(in_register_00000089,read);
  local_124 = (undefined4)CONCAT71(in_register_00000081,pointers);
  local_d0._M_allocated_capacity = (size_type)local_c0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0);
  local_11c = (int)CONCAT71(in_register_00000009,is_exception);
  if (local_11c == 0) {
    if ((is_user_struct) && (this->gen_templates_ == false)) {
      pcVar14 = " : public virtual ::apache::thrift::TBase";
      goto LAB_00180a06;
    }
  }
  else {
    pcVar14 = " : public ::apache::thrift::TException";
LAB_00180a06:
    std::__cxx11::string::_M_replace((ulong)&local_d0,0,(char *)local_d0._8_8_,(ulong)pcVar14);
  }
  pptVar15 = (tstruct->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
             super__Vector_impl_data._M_start;
  pptVar8 = (tstruct->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  local_130 = tstruct;
  if (pptVar15 == pptVar8) {
LAB_00180dff:
    local_120 = 0;
  }
  else {
    bVar3 = 0;
    do {
      bVar3 = bVar3 | (*pptVar15)->req_ != T_REQUIRED;
      pptVar15 = pptVar15 + 1;
    } while (pptVar15 != pptVar8);
    bVar3 = ((byte)local_124 ^ 1 | (byte)local_118) & bVar3;
    local_120 = CONCAT31((int3)((uint)local_124 >> 8),bVar3);
    if (bVar3 != 1) goto LAB_00180dff;
    t_generator::indent_abi_cxx11_((string *)&stack0xfffffffffffffe90,(t_generator *)this);
    poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                       (out,(char *)CONCAT71(in_stack_fffffffffffffe91,in_stack_fffffffffffffe90),
                        local_168);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"typedef struct _",0x10);
    iVar6 = (*(tstruct->super_t_type).super_t_doc._vptr_t_doc[3])(tstruct);
    poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar7,*(char **)CONCAT44(extraout_var,iVar6),
                        ((undefined8 *)CONCAT44(extraout_var,iVar6))[1]);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"__isset {",9);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar7,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
    if ((undefined1 *)CONCAT71(in_stack_fffffffffffffe91,in_stack_fffffffffffffe90) != local_160) {
      operator_delete((undefined1 *)CONCAT71(in_stack_fffffffffffffe91,in_stack_fffffffffffffe90));
    }
    piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
    *piVar1 = *piVar1 + 1;
    poVar7 = t_generator::indent((t_generator *)this,out);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"_",1);
    iVar6 = (*(tstruct->super_t_type).super_t_doc._vptr_t_doc[3])(tstruct);
    poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar7,*(char **)CONCAT44(extraout_var_00,iVar6),
                        ((undefined8 *)CONCAT44(extraout_var_00,iVar6))[1]);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"__isset() ",10);
    pptVar15 = (tstruct->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl
               .super__Vector_impl_data._M_start;
    pptVar8 = (tstruct->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
    if (pptVar15 != pptVar8) {
      bVar4 = true;
      do {
        if ((*pptVar15)->req_ != T_REQUIRED) {
          bVar22 = (*pptVar15)->value_ == (t_const_value *)0x0;
          pcVar14 = "true";
          if (bVar22) {
            pcVar14 = "false";
          }
          in_stack_fffffffffffffe90 = SUB81(local_160,0);
          in_stack_fffffffffffffe91 = (undefined7)((ulong)local_160 >> 8);
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&stack0xfffffffffffffe90,pcVar14,pcVar14 + (ulong)bVar22 + 4);
          if (bVar4) {
            std::__ostream_insert<char,std::char_traits<char>>(out,": ",2);
            ptVar21 = local_130;
            poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                               (out,((*pptVar15)->name_)._M_dataplus._M_p,
                                ((*pptVar15)->name_)._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>(poVar7,"(",1);
          }
          else {
            std::__ostream_insert<char,std::char_traits<char>>(out,", ",2);
            ptVar21 = local_130;
            poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                               (out,((*pptVar15)->name_)._M_dataplus._M_p,
                                ((*pptVar15)->name_)._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>(poVar7,"(",1);
          }
          poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar7,(char *)CONCAT71(in_stack_fffffffffffffe91,
                                                      in_stack_fffffffffffffe90),local_168);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7,")",1);
          if ((undefined1 *)CONCAT71(in_stack_fffffffffffffe91,in_stack_fffffffffffffe90) !=
              local_160) {
            operator_delete((undefined1 *)
                            CONCAT71(in_stack_fffffffffffffe91,in_stack_fffffffffffffe90));
          }
          pptVar8 = (ptVar21->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>.
                    _M_impl.super__Vector_impl_data._M_finish;
          bVar4 = false;
        }
        pptVar15 = pptVar15 + 1;
      } while (pptVar15 != pptVar8);
    }
    std::__ostream_insert<char,std::char_traits<char>>(out," {}",3);
    ptVar21 = local_130;
    std::__ostream_insert<char,std::char_traits<char>>
              (out,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
    pptVar15 = (ptVar21->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl
               .super__Vector_impl_data._M_start;
    pptVar8 = (ptVar21->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
    if (pptVar15 != pptVar8) {
      do {
        if ((*pptVar15)->req_ != T_REQUIRED) {
          poVar7 = t_generator::indent((t_generator *)this,out);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7,"bool ",5);
          poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar7,((*pptVar15)->name_)._M_dataplus._M_p,
                              ((*pptVar15)->name_)._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7," :1;",4);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar7,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
          pptVar8 = (local_130->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>.
                    _M_impl.super__Vector_impl_data._M_finish;
        }
        pptVar15 = pptVar15 + 1;
      } while (pptVar15 != pptVar8);
    }
    piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
    *piVar1 = *piVar1 + -1;
    poVar7 = t_generator::indent((t_generator *)this,out);
    tstruct = local_130;
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"} _",3);
    iVar6 = (*(tstruct->super_t_type).super_t_doc._vptr_t_doc[3])(tstruct);
    poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar7,*(char **)CONCAT44(extraout_var_01,iVar6),
                        ((undefined8 *)CONCAT44(extraout_var_01,iVar6))[1]);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"__isset;",8);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar7,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            (out,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  (*(this->super_t_oop_generator).super_t_generator._vptr_t_generator[0x22])(this,out,tstruct);
  t_generator::indent_abi_cxx11_((string *)&stack0xfffffffffffffe90,(t_generator *)this);
  poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                     (out,(char *)CONCAT71(in_stack_fffffffffffffe91,in_stack_fffffffffffffe90),
                      local_168);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,"class ",6);
  iVar6 = (*(tstruct->super_t_type).super_t_doc._vptr_t_doc[3])(tstruct);
  poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar7,*(char **)CONCAT44(extraout_var_02,iVar6),
                      ((undefined8 *)CONCAT44(extraout_var_02,iVar6))[1]);
  poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar7,(char *)local_d0._M_allocated_capacity,local_d0._8_8_);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7," {",2);
  poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar7,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  t_generator::indent_abi_cxx11_(&local_150,(t_generator *)this);
  poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar7,local_150._M_dataplus._M_p,local_150._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7," public:",8);
  poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar7,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar7,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_150._M_dataplus._M_p != &local_150.field_2) {
    operator_delete(local_150._M_dataplus._M_p);
  }
  ptVar9 = (t_cpp_generator *)CONCAT71(in_stack_fffffffffffffe91,in_stack_fffffffffffffe90);
  if (ptVar9 != (t_cpp_generator *)local_160) {
    operator_delete(ptVar9);
  }
  piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
  *piVar1 = *piVar1 + 1;
  if ((char)local_124 == '\0') {
    bVar4 = is_struct_storage_not_throwing(ptVar9,tstruct);
    poVar7 = t_generator::indent((t_generator *)this,out);
    iVar6 = (*(tstruct->super_t_type).super_t_doc._vptr_t_doc[3])(tstruct);
    poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar7,*(char **)CONCAT44(extraout_var_03,iVar6),
                        ((undefined8 *)CONCAT44(extraout_var_03,iVar6))[1]);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"(const ",7);
    iVar6 = (*(tstruct->super_t_type).super_t_doc._vptr_t_doc[3])(tstruct);
    poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar7,*(char **)CONCAT44(extraout_var_04,iVar6),
                        ((undefined8 *)CONCAT44(extraout_var_04,iVar6))[1]);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"&)",2);
    pcVar14 = "";
    if (bVar4) {
      pcVar14 = " noexcept";
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,pcVar14,(ulong)bVar4 * 9);
    poVar7 = std::__ostream_insert<char,std::char_traits<char>>(poVar7,&stack0xfffffffffffffe90,1);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar7,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
    ptVar9 = this;
    if (this->gen_moveable_ == true) {
      poVar7 = t_generator::indent((t_generator *)this,out);
      iVar6 = (*(tstruct->super_t_type).super_t_doc._vptr_t_doc[3])(tstruct);
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar7,*(char **)CONCAT44(extraout_var_05,iVar6),
                          ((undefined8 *)CONCAT44(extraout_var_05,iVar6))[1]);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"(",1);
      iVar6 = (*(tstruct->super_t_type).super_t_doc._vptr_t_doc[3])(tstruct);
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar7,*(char **)CONCAT44(extraout_var_06,iVar6),
                          ((undefined8 *)CONCAT44(extraout_var_06,iVar6))[1]);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"&&) noexcept;",0xd);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar7,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
      ptVar9 = this;
    }
    poVar7 = t_generator::indent((t_generator *)ptVar9,out);
    iVar6 = (*(tstruct->super_t_type).super_t_doc._vptr_t_doc[3])(tstruct);
    poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar7,*(char **)CONCAT44(extraout_var_07,iVar6),
                        ((undefined8 *)CONCAT44(extraout_var_07,iVar6))[1]);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"& operator=(const ",0x12);
    iVar6 = (*(tstruct->super_t_type).super_t_doc._vptr_t_doc[3])(tstruct);
    poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar7,*(char **)CONCAT44(extraout_var_08,iVar6),
                        ((undefined8 *)CONCAT44(extraout_var_08,iVar6))[1]);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"&)",2);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,pcVar14,(ulong)bVar4 * 9);
    poVar7 = std::__ostream_insert<char,std::char_traits<char>>(poVar7,&stack0xfffffffffffffe90,1);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar7,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
    this = ptVar9;
    if (ptVar9->gen_moveable_ == true) {
      poVar7 = t_generator::indent((t_generator *)ptVar9,out);
      iVar6 = (*(tstruct->super_t_type).super_t_doc._vptr_t_doc[3])(tstruct);
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar7,*(char **)CONCAT44(extraout_var_09,iVar6),
                          ((undefined8 *)CONCAT44(extraout_var_09,iVar6))[1]);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"& operator=(",0xc);
      iVar6 = (*(tstruct->super_t_type).super_t_doc._vptr_t_doc[3])(tstruct);
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar7,*(char **)CONCAT44(extraout_var_10,iVar6),
                          ((undefined8 *)CONCAT44(extraout_var_10,iVar6))[1]);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"&&) noexcept;",0xd);
      this = ptVar9;
      ptVar9 = (t_cpp_generator *)
               std::__ostream_insert<char,std::char_traits<char>>
                         (poVar7,::endl_abi_cxx11_._M_dataplus._M_p,
                          ::endl_abi_cxx11_._M_string_length);
    }
    pptVar15 = (tstruct->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl
               .super__Vector_impl_data._M_start;
    local_114 = (uint)CONCAT71((int7)((ulong)ptVar9 >> 8),1);
    if (pptVar15 !=
        (tstruct->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      do {
        ptVar10 = t_type::get_true_type((*pptVar15)->type_);
        ptVar16 = *pptVar15;
        if (ptVar16->reference_ == false) {
          iVar6 = (*(ptVar10->super_t_doc)._vptr_t_doc[6])(ptVar10);
          if ((char)iVar6 != '\0') {
            ptVar16 = *pptVar15;
            goto LAB_0018124b;
          }
        }
        else {
LAB_0018124b:
          if (ptVar16->value_ != (t_const_value *)0x0) {
            local_114 = 0;
            break;
          }
        }
        pptVar15 = pptVar15 + 1;
      } while (pptVar15 !=
               (tstruct->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl
               .super__Vector_impl_data._M_finish);
    }
    iVar6 = (*(tstruct->super_t_type).super_t_doc._vptr_t_doc[3])(tstruct);
    sVar23 = SUB81(local_160,0);
    uVar24 = (undefined7)((ulong)local_160 >> 8);
    lVar19 = *(long *)CONCAT44(extraout_var_11,iVar6);
    std::__cxx11::string::_M_construct<char*>
              ((string *)&stack0xfffffffffffffe90,lVar19,
               ((long *)CONCAT44(extraout_var_11,iVar6))[1] + lVar19);
    std::__cxx11::string::append(&stack0xfffffffffffffe90);
    poVar7 = t_generator::indent((t_generator *)this,out);
    poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar7,(char *)CONCAT71(uVar24,sVar23),local_168);
    cVar5 = (char)local_114;
    pcVar14 = " noexcept";
    if (cVar5 == '\0') {
      pcVar14 = "";
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,pcVar14,(ulong)(local_114 & 0xff) * 9)
    ;
    t_generator::indent_abi_cxx11_((string *)&local_110,(t_generator *)this);
    local_150._M_dataplus._M_p = (pointer)&local_150.field_2;
    std::__cxx11::string::_M_construct
              ((ulong)&local_150,(-cVar5 | 3U) + (char)local_110._8_8_ + (char)local_168);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_110._M_allocated_capacity != &local_100) {
      operator_delete((void *)local_110._M_allocated_capacity);
    }
    pptVar15 = (tstruct->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl
               .super__Vector_impl_data._M_start;
    if (pptVar15 !=
        (tstruct->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      bVar4 = false;
      do {
        ptVar11 = (t_const_value *)t_type::get_true_type((*pptVar15)->type_);
        cVar5 = (**(code **)(*(long *)&(ptVar11->mapVal_)._M_t._M_impl + 0x28))(ptVar11);
        if (((cVar5 != '\0') ||
            (cVar5 = (**(code **)(*(long *)&(ptVar11->mapVal_)._M_t._M_impl + 0x50))(ptVar11),
            cVar5 != '\0')) || ((*pptVar15)->reference_ == true)) {
          local_110._M_allocated_capacity = (size_type)&local_100;
          local_110._8_8_ = 0;
          local_100._M_local_buf[0] = '\0';
          ptVar16 = *pptVar15;
          if (ptVar16->value_ == (t_const_value *)0x0) {
            cVar5 = (**(code **)(*(long *)&(ptVar11->mapVal_)._M_t._M_impl + 0x50))(ptVar11);
            if (cVar5 != '\0') {
              type_name_abi_cxx11_((string *)local_50,this,(t_type *)ptVar11,false,false);
              plVar12 = (long *)std::__cxx11::string::replace
                                          ((ulong)local_50,0,(char *)0x0,0x382c93);
              local_b0 = (_Base_ptr)&local_a0;
              p_Var17 = (_Base_ptr)(plVar12 + 2);
              if ((_Base_ptr)*plVar12 == p_Var17) {
                local_a0 = *(_Base_ptr *)p_Var17;
                p_Stack_98 = (_Base_ptr)plVar12[3];
              }
              else {
                local_a0 = *(_Base_ptr *)p_Var17;
                local_b0 = (_Base_ptr)*plVar12;
              }
              local_a8 = (_Base_ptr)plVar12[1];
              *plVar12 = (long)p_Var17;
              plVar12[1] = 0;
              *(undefined1 *)(plVar12 + 2) = 0;
              plVar12 = (long *)std::__cxx11::string::append((char *)&local_b0);
              local_f0._M_allocated_capacity = (size_type)&local_e0;
              paVar18 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)(plVar12 + 2);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*plVar12 == paVar18) {
                local_e0._M_allocated_capacity = paVar18->_M_allocated_capacity;
                local_e0._8_8_ = plVar12[3];
              }
              else {
                local_e0._M_allocated_capacity = paVar18->_M_allocated_capacity;
                local_f0._M_allocated_capacity =
                     (size_type)
                     (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      *)*plVar12;
              }
              local_f0._8_8_ = plVar12[1];
              *plVar12 = (long)paVar18;
              plVar12[1] = 0;
              *(undefined1 *)(plVar12 + 2) = 0;
              std::__cxx11::string::_M_append(local_110._M_local_buf,local_f0._M_allocated_capacity)
              ;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_f0._M_allocated_capacity != &local_e0) {
                operator_delete((void *)local_f0._M_allocated_capacity);
              }
              if (local_b0 != (_Base_ptr)&local_a0) {
                operator_delete(local_b0);
              }
              ptVar10 = (t_type *)(local_50 + 0x10);
              ptVar20 = (t_type *)local_50._0_8_;
              goto LAB_001815ed;
            }
            (**(code **)(*(long *)&(ptVar11->mapVal_)._M_t._M_impl + 0x30))(ptVar11);
            std::__cxx11::string::append(local_110._M_local_buf);
          }
          else {
            ptVar10 = (t_type *)local_80;
            pcVar2 = (ptVar16->name_)._M_dataplus._M_p;
            local_90[0] = ptVar10;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)local_90,pcVar2,pcVar2 + (ptVar16->name_)._M_string_length);
            name._4_12_ = in_stack_fffffffffffffe7c;
            name._M_dataplus._M_p._0_4_ = in_stack_fffffffffffffe78;
            name.field_2._M_allocated_capacity = (size_type)this;
            name.field_2._M_local_buf[8] = (char)sVar23;
            name.field_2._9_7_ = uVar24;
            render_const_value((string *)&local_f0,this,out,name,ptVar10,ptVar11);
            std::__cxx11::string::_M_append(local_110._M_local_buf,local_f0._M_allocated_capacity);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_f0._M_allocated_capacity != &local_e0) {
              operator_delete((void *)local_f0._M_allocated_capacity);
            }
            ptVar10 = (t_type *)local_80;
            ptVar20 = local_90[0];
LAB_001815ed:
            if (ptVar20 != ptVar10) {
              operator_delete(ptVar20);
            }
          }
          if (bVar4) {
            std::__ostream_insert<char,std::char_traits<char>>(out,",\n",2);
            std::__ostream_insert<char,std::char_traits<char>>
                      (out,local_150._M_dataplus._M_p,local_150._M_string_length);
          }
          else if ((char)local_114 == '\0') {
            std::__ostream_insert<char,std::char_traits<char>>(out," : ",3);
          }
          else {
            local_f0._M_local_buf[0] = 10;
            poVar7 = std::__ostream_insert<char,std::char_traits<char>>(out,local_f0._M_local_buf,1)
            ;
            poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                               (poVar7,local_150._M_dataplus._M_p,local_150._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>(poVar7,": ",2);
            std::__cxx11::string::append((char *)&local_150);
          }
          poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                             (out,((*pptVar15)->name_)._M_dataplus._M_p,
                              ((*pptVar15)->name_)._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7,"(",1);
          poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar7,(char *)local_110._M_allocated_capacity,local_110._8_8_);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7,")",1);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_110._M_allocated_capacity != &local_100) {
            operator_delete((void *)local_110._M_allocated_capacity);
          }
          bVar4 = true;
        }
        pptVar15 = pptVar15 + 1;
      } while (pptVar15 !=
               (tstruct->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl
               .super__Vector_impl_data._M_finish);
    }
    std::__ostream_insert<char,std::char_traits<char>>(out," {",2);
    std::__ostream_insert<char,std::char_traits<char>>
              (out,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
    piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
    *piVar1 = *piVar1 + 1;
    pptVar15 = (tstruct->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl
               .super__Vector_impl_data._M_start;
    if (pptVar15 !=
        (tstruct->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      do {
        ptVar10 = t_type::get_true_type((*pptVar15)->type_);
        iVar6 = (*(ptVar10->super_t_doc)._vptr_t_doc[5])(ptVar10);
        if ((char)iVar6 == '\0') {
          ptVar16 = *pptVar15;
          ptVar11 = ptVar16->value_;
          if (ptVar11 != (t_const_value *)0x0) {
            pcVar2 = (ptVar16->name_)._M_dataplus._M_p;
            local_80._16_8_ = local_80 + 0x20;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)(local_80 + 0x10),pcVar2,pcVar2 + (ptVar16->name_)._M_string_length
                      );
            print_const_value(this,out,(string *)(local_80 + 0x10),ptVar10,ptVar11);
            if ((undefined1 *)local_80._16_8_ != local_80 + 0x20) {
              operator_delete((void *)local_80._16_8_);
            }
          }
        }
        pptVar15 = pptVar15 + 1;
      } while (pptVar15 !=
               (local_130->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>.
               _M_impl.super__Vector_impl_data._M_finish);
    }
    t_oop_generator::scope_down(&this->super_t_oop_generator,out);
    tstruct = local_130;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_150._M_dataplus._M_p != &local_150.field_2) {
      operator_delete(local_150._M_dataplus._M_p);
    }
    if ((undefined1 *)CONCAT71(uVar24,sVar23) != local_160) {
      operator_delete((undefined1 *)CONCAT71(uVar24,sVar23));
    }
  }
  sVar23 = SUB81(local_160,0);
  uVar24 = (undefined7)((ulong)local_160 >> 8);
  std::__cxx11::string::_M_construct<char_const*>((string *)&stack0xfffffffffffffe90,"final","");
  iVar13 = std::
           _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::find(&(tstruct->super_t_type).annotations_._M_t,(key_type *)&stack0xfffffffffffffe90);
  if ((undefined1 *)CONCAT71(uVar24,sVar23) != local_160) {
    operator_delete((undefined1 *)CONCAT71(uVar24,sVar23));
  }
  ptVar21 = local_130;
  if ((_Rb_tree_header *)iVar13._M_node ==
      &(tstruct->super_t_type).annotations_._M_t._M_impl.super__Rb_tree_header) {
    poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                       (out,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
    t_generator::indent_abi_cxx11_((string *)&stack0xfffffffffffffe90,(t_generator *)this);
    poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar7,(char *)CONCAT71(uVar24,sVar23),local_168);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"virtual ~",9);
    iVar6 = (*(ptVar21->super_t_type).super_t_doc._vptr_t_doc[3])(ptVar21);
    poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar7,*(char **)CONCAT44(extraout_var_12,iVar6),
                        ((undefined8 *)CONCAT44(extraout_var_12,iVar6))[1]);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"() noexcept;",0xc);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar7,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
    if ((undefined1 *)CONCAT71(uVar24,sVar23) != local_160) {
      operator_delete((undefined1 *)CONCAT71(uVar24,sVar23));
    }
  }
  pptVar15 = (ptVar21->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
             super__Vector_impl_data._M_start;
  if (pptVar15 !=
      (ptVar21->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    bVar3 = (byte)local_118;
    do {
      ptVar9 = this;
      (*(this->super_t_oop_generator).super_t_generator._vptr_t_generator[0x21])(this,out,*pptVar15)
      ;
      poVar7 = t_generator::indent((t_generator *)this,out);
      ptVar16 = *pptVar15;
      if ((char)local_124 == '\0') {
        pointer = false;
        this = ptVar9;
      }
      else {
        iVar6 = (*(ptVar16->type_->super_t_doc)._vptr_t_doc[0xc])();
        pointer = (byte)iVar6 ^ 1;
        this = ptVar9;
      }
      declare_field_abi_cxx11_
                ((string *)&stack0xfffffffffffffe90,this,ptVar16,false,(bool)pointer,
                 (bool)(bVar3 ^ 1),false);
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar7,(char *)CONCAT71(uVar24,sVar23),local_168);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar7,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
      if ((undefined1 *)CONCAT71(uVar24,sVar23) != local_160) {
        operator_delete((undefined1 *)CONCAT71(uVar24,sVar23));
      }
      pptVar15 = pptVar15 + 1;
    } while (pptVar15 !=
             (local_130->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl
             .super__Vector_impl_data._M_finish);
  }
  if ((char)local_120 != '\0') {
    poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                       (out,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
    ptVar21 = local_130;
    t_generator::indent_abi_cxx11_((string *)&stack0xfffffffffffffe90,(t_generator *)this);
    poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar7,(char *)CONCAT71(uVar24,sVar23),local_168);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"_",1);
    iVar6 = (*(ptVar21->super_t_type).super_t_doc._vptr_t_doc[3])(ptVar21);
    poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar7,*(char **)CONCAT44(extraout_var_13,iVar6),
                        ((undefined8 *)CONCAT44(extraout_var_13,iVar6))[1]);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"__isset __isset;",0x10);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar7,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
    if ((undefined1 *)CONCAT71(uVar24,sVar23) != local_160) {
      operator_delete((undefined1 *)CONCAT71(uVar24,sVar23));
    }
    pptVar15 = (ptVar21->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl
               .super__Vector_impl_data._M_finish;
  }
  ptVar21 = local_130;
  pptVar8 = (local_130->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (pptVar8 != pptVar15) {
    do {
      if ((char)local_124 == '\0') {
        if ((*pptVar8)->reference_ == true) {
          poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                             (out,::endl_abi_cxx11_._M_dataplus._M_p,
                              ::endl_abi_cxx11_._M_string_length);
          t_generator::indent_abi_cxx11_((string *)&stack0xfffffffffffffe90,(t_generator *)this);
          poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar7,(char *)CONCAT71(uVar24,sVar23),local_168);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7,"void __set_",0xb);
          poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar7,((*pptVar8)->name_)._M_dataplus._M_p,
                              ((*pptVar8)->name_)._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7,"(::std::shared_ptr<",0x13);
          type_name_abi_cxx11_(&local_150,this,(*pptVar8)->type_,false,false);
          poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar7,local_150._M_dataplus._M_p,local_150._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7,">",1);
        }
        else {
          poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                             (out,::endl_abi_cxx11_._M_dataplus._M_p,
                              ::endl_abi_cxx11_._M_string_length);
          t_generator::indent_abi_cxx11_((string *)&stack0xfffffffffffffe90,(t_generator *)this);
          poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar7,(char *)CONCAT71(uVar24,sVar23),local_168);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7,"void __set_",0xb);
          poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar7,((*pptVar8)->name_)._M_dataplus._M_p,
                              ((*pptVar8)->name_)._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7,"(",1);
          type_name_abi_cxx11_(&local_150,this,(*pptVar8)->type_,false,true);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar7,local_150._M_dataplus._M_p,local_150._M_string_length);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_150._M_dataplus._M_p != &local_150.field_2) {
          operator_delete(local_150._M_dataplus._M_p);
        }
        if ((undefined1 *)CONCAT71(uVar24,sVar23) != local_160) {
          operator_delete((undefined1 *)CONCAT71(uVar24,sVar23));
        }
        std::__ostream_insert<char,std::char_traits<char>>(out," val);",6);
        std::__ostream_insert<char,std::char_traits<char>>
                  (out,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
      }
      pptVar8 = pptVar8 + 1;
    } while (pptVar8 !=
             (ptVar21->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
             super__Vector_impl_data._M_finish);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            (out,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  if (((char)local_124 == '\0') && (this->gen_no_default_operators_ == false)) {
    t_generator::indent_abi_cxx11_((string *)&stack0xfffffffffffffe90,(t_generator *)this);
    poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                       (out,(char *)CONCAT71(uVar24,sVar23),local_168);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"bool operator == (const ",0x18);
    iVar6 = (*(ptVar21->super_t_type).super_t_doc._vptr_t_doc[3])(ptVar21);
    poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar7,*(char **)CONCAT44(extraout_var_14,iVar6),
                        ((undefined8 *)CONCAT44(extraout_var_14,iVar6))[1]);
    lVar19 = 3;
    std::__ostream_insert<char,std::char_traits<char>>(poVar7," & ",3);
    pcVar14 = "rhs";
    if ((ptVar21->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
        super__Vector_impl_data._M_finish ==
        (ptVar21->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
        super__Vector_impl_data._M_start) {
      pcVar14 = "/* rhs */";
      lVar19 = 9;
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,pcVar14,lVar19);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,") const",7);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar7,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
    ptVar9 = this;
    if ((undefined1 *)CONCAT71(uVar24,sVar23) != local_160) {
      operator_delete((undefined1 *)CONCAT71(uVar24,sVar23));
      ptVar9 = this;
    }
    t_oop_generator::scope_up(&ptVar9->super_t_oop_generator,out);
    pptVar15 = (ptVar21->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl
               .super__Vector_impl_data._M_start;
    if (pptVar15 !=
        (ptVar21->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      do {
        if ((*pptVar15)->req_ == T_OPTIONAL) {
          t_generator::indent_abi_cxx11_((string *)&stack0xfffffffffffffe90,(t_generator *)ptVar9);
          poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                             (out,(char *)CONCAT71(uVar24,sVar23),local_168);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7,"if (__isset.",0xc);
          poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar7,((*pptVar15)->name_)._M_dataplus._M_p,
                              ((*pptVar15)->name_)._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7," != rhs.__isset.",0x10);
          poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar7,((*pptVar15)->name_)._M_dataplus._M_p,
                              ((*pptVar15)->name_)._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7,")",1);
          poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar7,::endl_abi_cxx11_._M_dataplus._M_p,
                              ::endl_abi_cxx11_._M_string_length);
          t_generator::indent_abi_cxx11_(&local_150,(t_generator *)ptVar9);
          poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar7,local_150._M_dataplus._M_p,local_150._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7,"  return false;",0xf);
          poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar7,::endl_abi_cxx11_._M_dataplus._M_p,
                              ::endl_abi_cxx11_._M_string_length);
          t_generator::indent_abi_cxx11_((string *)&local_110,(t_generator *)ptVar9);
          poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar7,(char *)local_110._M_allocated_capacity,local_110._8_8_);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7,"else if (__isset.",0x11);
          poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar7,((*pptVar15)->name_)._M_dataplus._M_p,
                              ((*pptVar15)->name_)._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7," && !(",6);
          poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar7,((*pptVar15)->name_)._M_dataplus._M_p,
                              ((*pptVar15)->name_)._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7," == rhs.",8);
          poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar7,((*pptVar15)->name_)._M_dataplus._M_p,
                              ((*pptVar15)->name_)._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7,"))",2);
          poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar7,::endl_abi_cxx11_._M_dataplus._M_p,
                              ::endl_abi_cxx11_._M_string_length);
          t_generator::indent_abi_cxx11_((string *)&local_f0,(t_generator *)ptVar9);
          poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar7,(char *)local_f0._M_allocated_capacity,local_f0._8_8_);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7,"  return false;",0xf);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar7,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_f0._M_allocated_capacity != &local_e0) {
            operator_delete((void *)local_f0._M_allocated_capacity);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_110._M_allocated_capacity != &local_100) {
            operator_delete((void *)local_110._M_allocated_capacity);
          }
        }
        else {
          t_generator::indent_abi_cxx11_((string *)&stack0xfffffffffffffe90,(t_generator *)ptVar9);
          poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                             (out,(char *)CONCAT71(uVar24,sVar23),local_168);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7,"if (!(",6);
          poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar7,((*pptVar15)->name_)._M_dataplus._M_p,
                              ((*pptVar15)->name_)._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7," == rhs.",8);
          poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar7,((*pptVar15)->name_)._M_dataplus._M_p,
                              ((*pptVar15)->name_)._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7,"))",2);
          poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar7,::endl_abi_cxx11_._M_dataplus._M_p,
                              ::endl_abi_cxx11_._M_string_length);
          t_generator::indent_abi_cxx11_(&local_150,(t_generator *)ptVar9);
          poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar7,local_150._M_dataplus._M_p,local_150._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7,"  return false;",0xf);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar7,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_150._M_dataplus._M_p != &local_150.field_2) {
          operator_delete(local_150._M_dataplus._M_p);
        }
        if ((undefined1 *)CONCAT71(uVar24,sVar23) != local_160) {
          operator_delete((undefined1 *)CONCAT71(uVar24,sVar23));
        }
        pptVar15 = pptVar15 + 1;
      } while (pptVar15 !=
               (ptVar21->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl
               .super__Vector_impl_data._M_finish);
    }
    poVar7 = t_generator::indent((t_generator *)ptVar9,out);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"return true;",0xc);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar7,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
    t_oop_generator::scope_down(&ptVar9->super_t_oop_generator,out);
    this = ptVar9;
    t_generator::indent_abi_cxx11_((string *)&stack0xfffffffffffffe90,(t_generator *)ptVar9);
    poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                       (out,(char *)CONCAT71(uVar24,sVar23),local_168);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"bool operator != (const ",0x18);
    iVar6 = (*(ptVar21->super_t_type).super_t_doc._vptr_t_doc[3])(ptVar21);
    poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar7,*(char **)CONCAT44(extraout_var_15,iVar6),
                        ((undefined8 *)CONCAT44(extraout_var_15,iVar6))[1]);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7," &rhs) const {",0xe);
    poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar7,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length
                       );
    t_generator::indent_abi_cxx11_(&local_150,(t_generator *)ptVar9);
    poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar7,local_150._M_dataplus._M_p,local_150._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"  return !(*this == rhs);",0x19);
    poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar7,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length
                       );
    t_generator::indent_abi_cxx11_((string *)&local_110,(t_generator *)ptVar9);
    poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar7,(char *)local_110._M_allocated_capacity,local_110._8_8_);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"}",1);
    poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar7,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length
                       );
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar7,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_110._M_allocated_capacity != &local_100) {
      operator_delete((void *)local_110._M_allocated_capacity);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_150._M_dataplus._M_p != &local_150.field_2) {
      operator_delete(local_150._M_dataplus._M_p);
    }
    if ((undefined1 *)CONCAT71(uVar24,sVar23) != local_160) {
      operator_delete((undefined1 *)CONCAT71(uVar24,sVar23));
    }
    t_generator::indent_abi_cxx11_((string *)&stack0xfffffffffffffe90,(t_generator *)ptVar9);
    poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                       (out,(char *)CONCAT71(uVar24,sVar23),local_168);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"bool operator < (const ",0x17);
    iVar6 = (*(ptVar21->super_t_type).super_t_doc._vptr_t_doc[3])(ptVar21);
    poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar7,*(char **)CONCAT44(extraout_var_16,iVar6),
                        ((undefined8 *)CONCAT44(extraout_var_16,iVar6))[1]);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7," & ) const;",0xb);
    poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar7,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length
                       );
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar7,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
    if ((undefined1 *)CONCAT71(uVar24,sVar23) != local_160) {
      operator_delete((undefined1 *)CONCAT71(uVar24,sVar23));
    }
  }
  if ((byte)local_118 != '\0') {
    if (this->gen_templates_ == true) {
      ptVar9 = this;
      t_generator::indent_abi_cxx11_((string *)&stack0xfffffffffffffe90,(t_generator *)this);
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                         (out,(char *)CONCAT71(uVar24,sVar23),local_168);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"template <class Protocol_>",0x1a);
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar7,::endl_abi_cxx11_._M_dataplus._M_p,
                          ::endl_abi_cxx11_._M_string_length);
      t_generator::indent_abi_cxx11_(&local_150,(t_generator *)this);
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar7,local_150._M_dataplus._M_p,local_150._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar7,"uint32_t read(Protocol_* iprot);",0x20);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar7,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
      this = ptVar9;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_150._M_dataplus._M_p != &local_150.field_2) {
        operator_delete(local_150._M_dataplus._M_p);
        this = ptVar9;
      }
      if ((undefined1 *)CONCAT71(uVar24,sVar23) != local_160) {
        operator_delete((undefined1 *)CONCAT71(uVar24,sVar23));
      }
    }
    else {
      t_generator::indent_abi_cxx11_((string *)&stack0xfffffffffffffe90,(t_generator *)this);
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                         (out,(char *)CONCAT71(uVar24,sVar23),local_168);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"uint32_t read(",0xe);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar7,"::apache::thrift::protocol::TProtocol* iprot)",0x2d);
      if ((undefined1 *)CONCAT71(uVar24,sVar23) != local_160) {
        operator_delete((undefined1 *)CONCAT71(uVar24,sVar23));
      }
      if (((char)local_11c == '\0') && ((char *)local_d0._8_8_ != (char *)0x0)) {
        std::__ostream_insert<char,std::char_traits<char>>(out," override",9);
      }
      sVar23 = (string)0x3b;
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>(out,&stack0xfffffffffffffe90,1);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar7,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
    }
  }
  if (write) {
    if (this->gen_templates_ == true) {
      ptVar9 = this;
      t_generator::indent_abi_cxx11_((string *)&stack0xfffffffffffffe90,(t_generator *)this);
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                         (out,(char *)CONCAT71(uVar24,sVar23),local_168);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"template <class Protocol_>",0x1a);
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar7,::endl_abi_cxx11_._M_dataplus._M_p,
                          ::endl_abi_cxx11_._M_string_length);
      t_generator::indent_abi_cxx11_(&local_150,(t_generator *)this);
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar7,local_150._M_dataplus._M_p,local_150._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar7,"uint32_t write(Protocol_* oprot) const;",0x27);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar7,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
      this = ptVar9;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_150._M_dataplus._M_p != &local_150.field_2) {
        operator_delete(local_150._M_dataplus._M_p);
        this = ptVar9;
      }
      if ((undefined1 *)CONCAT71(uVar24,sVar23) != local_160) {
        operator_delete((undefined1 *)CONCAT71(uVar24,sVar23));
      }
    }
    else {
      t_generator::indent_abi_cxx11_((string *)&stack0xfffffffffffffe90,(t_generator *)this);
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                         (out,(char *)CONCAT71(uVar24,sVar23),local_168);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"uint32_t write(",0xf);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar7,"::apache::thrift::protocol::TProtocol* oprot) const",0x33);
      if ((undefined1 *)CONCAT71(uVar24,sVar23) != local_160) {
        operator_delete((undefined1 *)CONCAT71(uVar24,sVar23));
      }
      if (((char)local_11c == '\0') && ((char *)local_d0._8_8_ != (char *)0x0)) {
        std::__ostream_insert<char,std::char_traits<char>>(out," override",9);
      }
      sVar23 = (string)0x3b;
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>(out,&stack0xfffffffffffffe90,1);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar7,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
    }
  }
  std::__ostream_insert<char,std::char_traits<char>>
            (out,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  if ((is_user_struct) && (bVar4 = has_custom_ostream(this,&ptVar21->super_t_type), !bVar4)) {
    t_generator::indent_abi_cxx11_((string *)&stack0xfffffffffffffe90,(t_generator *)this);
    poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                       (out,(char *)CONCAT71(uVar24,sVar23),local_168);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"virtual ",8);
    if ((undefined1 *)CONCAT71(uVar24,sVar23) != local_160) {
      operator_delete((undefined1 *)CONCAT71(uVar24,sVar23));
    }
    std::__ostream_insert<char,std::char_traits<char>>(out,"void ",5);
    std::__ostream_insert<char,std::char_traits<char>>(out,"printTo(std::ostream& out) const",0x20);
    std::__ostream_insert<char,std::char_traits<char>>(out,";",1);
    std::__ostream_insert<char,std::char_traits<char>>
              (out,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  }
  if ((char)local_11c != '\0') {
    ptVar9 = this;
    t_generator::indent_abi_cxx11_((string *)&stack0xfffffffffffffe90,(t_generator *)this);
    poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                       (out,(char *)CONCAT71(uVar24,sVar23),local_168);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar7,"mutable std::string thriftTExceptionMessageHolder_;",0x33);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar7,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
    if ((undefined1 *)CONCAT71(uVar24,sVar23) != local_160) {
      operator_delete((undefined1 *)CONCAT71(uVar24,sVar23));
    }
    t_generator::indent_abi_cxx11_((string *)&stack0xfffffffffffffe90,(t_generator *)this);
    std::__ostream_insert<char,std::char_traits<char>>
              (out,(char *)CONCAT71(uVar24,sVar23),local_168);
    this_00 = (t_cpp_generator *)CONCAT71(uVar24,sVar23);
    this = ptVar9;
    if (this_00 != (t_cpp_generator *)local_160) {
      operator_delete(this_00);
      this = ptVar9;
    }
    generate_exception_what_method_decl(this_00,out,ptVar21,false);
    std::__ostream_insert<char,std::char_traits<char>>(out,";",1);
    std::__ostream_insert<char,std::char_traits<char>>
              (out,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  }
  piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
  *piVar1 = *piVar1 + -1;
  poVar7 = t_generator::indent((t_generator *)this,out);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,"};",2);
  ptVar9 = (t_cpp_generator *)
           std::__ostream_insert<char,std::char_traits<char>>
                     (poVar7,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)ptVar9,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length
            );
  if (!swap) goto LAB_00182b19;
  iVar6 = (*(ptVar21->super_t_type).super_t_doc._vptr_t_doc[3])(ptVar21);
  iVar6 = std::__cxx11::string::compare((char *)CONCAT44(extraout_var_17,iVar6));
  if (iVar6 == 0) {
LAB_00182a43:
    t_generator::indent_abi_cxx11_((string *)&stack0xfffffffffffffe90,(t_generator *)this);
    poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                       (out,(char *)CONCAT71(uVar24,sVar23),local_168);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"void swap(",10);
    iVar6 = (*(ptVar21->super_t_type).super_t_doc._vptr_t_doc[3])(ptVar21);
    poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar7,*(char **)CONCAT44(extraout_var_21,iVar6),
                        ((undefined8 *)CONCAT44(extraout_var_21,iVar6))[1]);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7," &a1, ",6);
    iVar6 = (*(ptVar21->super_t_type).super_t_doc._vptr_t_doc[3])(ptVar21);
    poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar7,*(char **)CONCAT44(extraout_var_22,iVar6),
                        ((undefined8 *)CONCAT44(extraout_var_22,iVar6))[1]);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7," &a2);",6);
    poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar7,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length
                       );
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar7,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  }
  else {
    iVar6 = (*(ptVar21->super_t_type).super_t_doc._vptr_t_doc[3])(ptVar21);
    iVar6 = std::__cxx11::string::compare((char *)CONCAT44(extraout_var_18,iVar6));
    if (iVar6 == 0) goto LAB_00182a43;
    t_generator::indent_abi_cxx11_((string *)&stack0xfffffffffffffe90,(t_generator *)this);
    poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                       (out,(char *)CONCAT71(uVar24,sVar23),local_168);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"void swap(",10);
    iVar6 = (*(ptVar21->super_t_type).super_t_doc._vptr_t_doc[3])(ptVar21);
    poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar7,*(char **)CONCAT44(extraout_var_19,iVar6),
                        ((undefined8 *)CONCAT44(extraout_var_19,iVar6))[1]);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7," &a, ",5);
    iVar6 = (*(ptVar21->super_t_type).super_t_doc._vptr_t_doc[3])(ptVar21);
    poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar7,*(char **)CONCAT44(extraout_var_20,iVar6),
                        ((undefined8 *)CONCAT44(extraout_var_20,iVar6))[1]);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7," &b);",5);
    poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar7,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length
                       );
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar7,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  }
  ptVar9 = (t_cpp_generator *)CONCAT71(uVar24,sVar23);
  if (ptVar9 != (t_cpp_generator *)local_160) {
    operator_delete(ptVar9);
  }
LAB_00182b19:
  if (is_user_struct) {
    generate_struct_ostream_operator_decl(ptVar9,out,ptVar21);
  }
  if ((char *)local_d0._M_allocated_capacity != local_c0) {
    operator_delete((void *)local_d0._M_allocated_capacity);
  }
  return;
}

Assistant:

void t_cpp_generator::generate_struct_declaration(ostream& out,
                                                  t_struct* tstruct,
                                                  bool is_exception,
                                                  bool pointers,
                                                  bool read,
                                                  bool write,
                                                  bool swap,
                                                  bool is_user_struct) {
  string extends = "";
  if (is_exception) {
    extends = " : public ::apache::thrift::TException";
  } else {
    if (is_user_struct && !gen_templates_) {
      extends = " : public virtual ::apache::thrift::TBase";
    }
  }

  // Get members
  vector<t_field*>::const_iterator m_iter;
  const vector<t_field*>& members = tstruct->get_members();

  // Write the isset structure declaration outside the class. This makes
  // the generated code amenable to processing by SWIG.
  // We only declare the struct if it gets used in the class.

  // Isset struct has boolean fields, but only for non-required fields.
  bool has_nonrequired_fields = false;
  for (m_iter = members.begin(); m_iter != members.end(); ++m_iter) {
    if ((*m_iter)->get_req() != t_field::T_REQUIRED)
      has_nonrequired_fields = true;
  }

  if (has_nonrequired_fields && (!pointers || read)) {

    out << indent() << "typedef struct _" << tstruct->get_name() << "__isset {" << endl;
    indent_up();

    indent(out) << "_" << tstruct->get_name() << "__isset() ";
    bool first = true;
    for (m_iter = members.begin(); m_iter != members.end(); ++m_iter) {
      if ((*m_iter)->get_req() == t_field::T_REQUIRED) {
        continue;
      }
      string isSet = ((*m_iter)->get_value() != nullptr) ? "true" : "false";
      if (first) {
        first = false;
        out << ": " << (*m_iter)->get_name() << "(" << isSet << ")";
      } else {
        out << ", " << (*m_iter)->get_name() << "(" << isSet << ")";
      }
    }
    out << " {}" << endl;

    for (m_iter = members.begin(); m_iter != members.end(); ++m_iter) {
      if ((*m_iter)->get_req() != t_field::T_REQUIRED) {
        indent(out) << "bool " << (*m_iter)->get_name() << " :1;" << endl;
      }
    }

    indent_down();
    indent(out) << "} _" << tstruct->get_name() << "__isset;" << endl;
  }

  out << endl;

  generate_java_doc(out, tstruct);

  // Open struct def
  out << indent() << "class " << tstruct->get_name() << extends << " {" << endl << indent()
      << " public:" << endl << endl;
  indent_up();

  if (!pointers) {
    bool ok_noexcept = is_struct_storage_not_throwing(tstruct);
    // Copy constructor
    indent(out) << tstruct->get_name() << "(const " << tstruct->get_name() << "&)"
                << (ok_noexcept? " noexcept" : "") << ';' << endl;

    // Move constructor
    if (gen_moveable_) {
      indent(out) << tstruct->get_name() << "(" << tstruct->get_name() << "&&) noexcept;" 
                  << endl;
    }

    // Assignment Operator
    indent(out) << tstruct->get_name() << "& operator=(const " << tstruct->get_name() << "&)"
                << (ok_noexcept? " noexcept" : "") << ';' << endl;

    // Move assignment operator
    if (gen_moveable_) {
      indent(out) << tstruct->get_name() << "& operator=(" << tstruct->get_name() << "&&) noexcept;" 
                  << endl;
    }

    bool has_default_value = false;
    for (m_iter = members.begin(); m_iter != members.end(); ++m_iter) {
      t_type* t = get_true_type((*m_iter)->get_type());
      if (is_reference(*m_iter) || t->is_string()) {
        t_const_value* cv = (*m_iter)->get_value();
        if (cv != nullptr) {
          has_default_value = true;
          break;
        }
      }
    }

    // Default constructor
    std::string clsname_ctor = tstruct->get_name() + "()";
    indent(out) << clsname_ctor << (has_default_value ? "" : " noexcept");

    bool init_ctor = false;
    std::string args_indent(
      indent().size() + clsname_ctor.size() + (has_default_value ? 3 : -1), ' ');

    for (m_iter = members.begin(); m_iter != members.end(); ++m_iter) {
      t_type* t = get_true_type((*m_iter)->get_type());
      if (t->is_base_type() || t->is_enum() || is_reference(*m_iter)) {
        string dval;
        t_const_value* cv = (*m_iter)->get_value();
        if (cv != nullptr) {
          dval += render_const_value(out, (*m_iter)->get_name(), t, cv);
        } else if (t->is_enum()) {
          dval += "static_cast<" + type_name(t) + ">(0)";
        } else {
          dval += (t->is_string() || is_reference(*m_iter)) ? "" : "0";
        }
        if (!init_ctor) {
          init_ctor = true;
          if(has_default_value) {
            out << " : ";
          } else {
            out << '\n' << args_indent << ": ";
            args_indent.append("  ");
          }
        } else {
          out << ",\n" << args_indent;
        }
        out << (*m_iter)->get_name() << "(" << dval << ")";
      }
    }
    out << " {" << endl;
    indent_up();
    // TODO(dreiss): When everything else in Thrift is perfect,
    // do more of these in the initializer list.
    for (m_iter = members.begin(); m_iter != members.end(); ++m_iter) {
      t_type* t = get_true_type((*m_iter)->get_type());

      if (!t->is_base_type()) {
        t_const_value* cv = (*m_iter)->get_value();
        if (cv != nullptr) {
          print_const_value(out, (*m_iter)->get_name(), t, cv);
        }
      }
    }
    scope_down(out);
  }

  if (tstruct->annotations_.find("final") == tstruct->annotations_.end()) {
    out << endl << indent() << "virtual ~" << tstruct->get_name() << "() noexcept;" << endl;
  }

  // Declare all fields
  for (m_iter = members.begin(); m_iter != members.end(); ++m_iter) {
	generate_java_doc(out, *m_iter);
    indent(out) << declare_field(*m_iter,
                                 false,
                                 (pointers && !(*m_iter)->get_type()->is_xception()),
                                 !read) << endl;
  }

  // Add the __isset data member if we need it, using the definition from above
  if (has_nonrequired_fields && (!pointers || read)) {
    out << endl << indent() << "_" << tstruct->get_name() << "__isset __isset;" << endl;
  }

  // Create a setter function for each field
  for (m_iter = members.begin(); m_iter != members.end(); ++m_iter) {
    if (pointers) {
      continue;
    }
    if (is_reference((*m_iter))) {
      out << endl << indent() << "void __set_" << (*m_iter)->get_name() << "(::std::shared_ptr<"
          << type_name((*m_iter)->get_type(), false, false) << ">";
      out << " val);" << endl;
    } else {
      out << endl << indent() << "void __set_" << (*m_iter)->get_name() << "("
          << type_name((*m_iter)->get_type(), false, true);
      out << " val);" << endl;
    }
  }
  out << endl;

  if (!pointers) {
    // Should we generate default operators?
    if (!gen_no_default_operators_) {
      // Generate an equality testing operator.  Make it inline since the compiler
      // will do a better job than we would when deciding whether to inline it.
      out << indent() << "bool operator == (const " << tstruct->get_name() << " & "
          << (members.size() > 0 ? "rhs" : "/* rhs */") << ") const" << endl;
      scope_up(out);
      for (m_iter = members.begin(); m_iter != members.end(); ++m_iter) {
        // Most existing Thrift code does not use isset or optional/required,
        // so we treat "default" fields as required.
        if ((*m_iter)->get_req() != t_field::T_OPTIONAL) {
          out << indent() << "if (!(" << (*m_iter)->get_name() << " == rhs."
              << (*m_iter)->get_name() << "))" << endl << indent() << "  return false;" << endl;
        } else {
          out << indent() << "if (__isset." << (*m_iter)->get_name() << " != rhs.__isset."
              << (*m_iter)->get_name() << ")" << endl << indent() << "  return false;" << endl
              << indent() << "else if (__isset." << (*m_iter)->get_name() << " && !("
              << (*m_iter)->get_name() << " == rhs." << (*m_iter)->get_name() << "))" << endl
              << indent() << "  return false;" << endl;
        }
      }
      indent(out) << "return true;" << endl;
      scope_down(out);
      out << indent() << "bool operator != (const " << tstruct->get_name() << " &rhs) const {"
          << endl << indent() << "  return !(*this == rhs);" << endl << indent() << "}" << endl
          << endl;

      // Generate the declaration of a less-than operator.  This must be
      // implemented by the application developer if they wish to use it.  (They
      // will get a link error if they try to use it without an implementation.)
      out << indent() << "bool operator < (const " << tstruct->get_name() << " & ) const;" << endl
          << endl;
    }
  }

  if (read) {
    if (gen_templates_) {
      out << indent() << "template <class Protocol_>" << endl << indent()
          << "uint32_t read(Protocol_* iprot);" << endl;
    } else {
      out << indent() << "uint32_t read("
          << "::apache::thrift::protocol::TProtocol* iprot)";
      if(!is_exception && !extends.empty())
        out << " override";
      out << ';' << endl;
    }
  }
  if (write) {
    if (gen_templates_) {
      out << indent() << "template <class Protocol_>" << endl << indent()
          << "uint32_t write(Protocol_* oprot) const;" << endl;
    } else {
      out << indent() << "uint32_t write("
          << "::apache::thrift::protocol::TProtocol* oprot) const";
      if(!is_exception && !extends.empty())
        out << " override";
      out << ';' << endl;
    }
  }
  out << endl;

  if (is_user_struct && !has_custom_ostream(tstruct)) {
    out << indent() << "virtual ";
    generate_struct_print_method_decl(out, nullptr);
    out << ";" << endl;
  }

  // std::exception::what()
  if (is_exception) {
    out << indent() << "mutable std::string thriftTExceptionMessageHolder_;" << endl;
    out << indent();
    generate_exception_what_method_decl(out, tstruct, false);
    out << ";" << endl;
  }

  indent_down();
  indent(out) << "};" << endl << endl;

  if (swap) {
    // Generate a namespace-scope swap() function
    if (tstruct->get_name() == "a" || tstruct->get_name() == "b") {
      out << indent() << "void swap(" << tstruct->get_name() << " &a1, " << tstruct->get_name()
          << " &a2);" << endl << endl;
    } else {
       out << indent() << "void swap(" << tstruct->get_name() << " &a, " << tstruct->get_name()
           << " &b);" << endl << endl;
    }
  }

  if (is_user_struct) {
    generate_struct_ostream_operator_decl(out, tstruct);
  }
}